

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot-file.c
# Opt level: O0

void faup_snapshot_info_write(char *snapshot_dir)

{
  int iVar1;
  char *pcStack_28;
  int retval;
  char *info_file;
  time_t current;
  FILE *fp;
  char *snapshot_dir_local;
  
  fp = (FILE *)snapshot_dir;
  info_file = (char *)time((time_t *)0x0);
  iVar1 = asprintf(&stack0xffffffffffffffd8,"%s%c%s",fp,0x2f,"_info");
  if (iVar1 < 0) {
    fprintf(_stderr,"Error: cannot concatenate _info part!\n");
  }
  else {
    current = (time_t)fopen(pcStack_28,"wb+");
    fwrite(&info_file,8,1,(FILE *)current);
    fclose((FILE *)current);
    free(pcStack_28);
  }
  return;
}

Assistant:

void faup_snapshot_info_write(char *snapshot_dir)
{
  FILE *fp;
  time_t current;
  char *info_file;
  int retval;
  
  current = time(NULL);

  retval = asprintf(&info_file, "%s%c%s", snapshot_dir, FAUP_OS_DIRSEP_C, "_info");
  if (retval < 0) {
    fprintf(stderr, "Error: cannot concatenate _info part!\n");
    return;
  }
  fp = fopen(info_file, "wb+");
  fwrite(&current, sizeof(time_t), 1, fp);  
  fclose(fp);

  free(info_file);
}